

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

int cram_add_hardclip(cram_container *c,cram_slice *s,cram_record *r,int pos,int len,char *base)

{
  int iVar1;
  undefined1 local_40 [8];
  cram_feature f;
  char *base_local;
  int len_local;
  int pos_local;
  cram_record *r_local;
  cram_slice *s_local;
  cram_container *c_local;
  
  local_40._0_4_ = pos + 1;
  local_40._4_4_ = 0x48;
  f.field_0.X.pos = len;
  f.field_0._8_8_ = base;
  cram_stats_add(c->stats[0x24],len);
  iVar1 = cram_add_feature(c,s,r,(cram_feature *)local_40);
  return iVar1;
}

Assistant:

static int cram_add_hardclip(cram_container *c, cram_slice *s, cram_record *r,
			     int pos, int len, char *base) {
    cram_feature f;
    f.S.pos = pos+1;
    f.S.code = 'H';
    f.S.len = len;
    cram_stats_add(c->stats[DS_HC], len);
    return cram_add_feature(c, s, r, &f);
}